

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowCollapsed(ImGuiWindow *window,bool collapsed,ImGuiCond cond)

{
  ImGuiCond cond_local;
  bool collapsed_local;
  ImGuiWindow *window_local;
  
  if ((cond == 0) || (((*(int *)&window->field_0xbc << 8) >> 0x18 & cond) != 0)) {
    *(uint *)&window->field_0xbc =
         *(uint *)&window->field_0xbc & 0xff00ffff |
         ((*(int *)&window->field_0xbc << 8) >> 0x18 & 0xf1U) << 0x10;
    window->Collapsed = collapsed;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(ImGuiWindow* window, bool collapsed, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowCollapsedAllowFlags & cond) == 0)
        return;
    window->SetWindowCollapsedAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    window->Collapsed = collapsed;
}